

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

p_ply_property ply_get_next_property(p_ply_element element,p_ply_property last)

{
  p_ply_property ptVar1;
  
  if (last != (p_ply_property)0x0) {
    ptVar1 = (p_ply_property)0x0;
    if (last + 1 < element->property + element->nproperties) {
      ptVar1 = last + 1;
    }
    return ptVar1;
  }
  return element->property;
}

Assistant:

p_ply_property ply_get_next_property(p_ply_element element,
                                     p_ply_property last) {
    assert(element);
    if (!last) return element->property;
    last++;
    if (last < element->property + element->nproperties)
        return last;
    else
        return NULL;
}